

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void anon_unknown.dwarf_1117a3::ReportAt
               (ExpressionContext *ctx,SynBase *source,char *pos,char *msg,__va_list_tag *args)

{
  SmallArray<ErrorInfo_*,_4U> *this;
  Allocator *pAVar1;
  Lexeme *pLVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  undefined4 extraout_var;
  char *pcVar8;
  ModuleData *pMVar9;
  char *pcVar10;
  ErrorInfo *pEVar7;
  
  pcVar8 = ctx->errorBuf;
  if ((pcVar8 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = pcVar8;
      pcVar10 = pcVar8;
    }
    else {
      pcVar10 = ctx->errorBufLocation;
    }
    vsnprintf(pcVar10,(ulong)(ctx->errorBufSize + ((int)pcVar8 - (int)pcVar10)),msg,args);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    pcVar8 = ctx->errorBufLocation;
    pcVar5 = strstr(pcVar8,"%error-type%");
    if (pcVar5 != (char *)0x0) {
      __assert_fail("strstr(ctx.errorBufLocation, \"%error-type%\") == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x48,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
    sVar6 = strlen(pcVar8);
    ctx->errorBufLocation = pcVar8 + sVar6;
    this = &ctx->errorInfo;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar7 = (ErrorInfo *)CONCAT44(extraout_var,iVar3);
    pAVar1 = ctx->allocator;
    pEVar7->messageStart = pcVar10;
    pEVar7->messageEnd = pcVar8 + sVar6;
    pLVar2 = source->end;
    pEVar7->begin = source->begin;
    pEVar7->end = pLVar2;
    pEVar7->pos = pos;
    (pEVar7->related).allocator = pAVar1;
    (pEVar7->related).data = (pEVar7->related).little;
    (pEVar7->related).count = 0;
    (pEVar7->related).max = 4;
    pEVar7->parentModule = (ModuleData *)0x0;
    uVar4 = (ctx->errorInfo).count;
    if (uVar4 == (ctx->errorInfo).max) {
      SmallArray<ErrorInfo_*,_4U>::grow(this,uVar4);
    }
    if (this->data == (ErrorInfo **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]"
                   );
    }
    uVar4 = (ctx->errorInfo).count;
    (ctx->errorInfo).count = uVar4 + 1;
    this->data[uVar4] = pEVar7;
    pcVar8 = FindModuleCodeWithSourceLocation(ctx,pos);
    if (pcVar8 != (char *)0x0) {
      AddErrorLocationInfo
                (pcVar8,pos,ctx->errorBufLocation,
                 (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
      pcVar10 = ctx->errorBufLocation;
      sVar6 = strlen(pcVar10);
      ctx->errorBufLocation = pcVar10 + sVar6;
      if (pcVar8 != ctx->code) {
        pMVar9 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
        if (pMVar9 != (ModuleData *)0x0) {
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                    ctx->errorBufSize)," [in module \'%.*s\']\n",
                             (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin))
          ;
          pcVar8 = ctx->errorBufLocation;
          sVar6 = strlen(pcVar8);
          ctx->errorBufLocation = pcVar8 + sVar6;
          uVar4 = (ctx->errorInfo).count;
          if (uVar4 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,"T &SmallArray<ErrorInfo *, 4>::back() [T = ErrorInfo *, N = 4]");
          }
          this->data[uVar4 - 1]->parentModule = pMVar9;
        }
      }
    }
  }
  if (ctx->errorHandlerNested == true) {
    if (ctx->errorHandlerActive == false) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
  }
  else {
    uVar4 = ctx->errorCount + 1;
    ctx->errorCount = uVar4;
    if (uVar4 != 100) {
      return;
    }
    NULLC::SafeSprintf(ctx->errorBufLocation,
                       (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                              ctx->errorBufSize),"ERROR: error limit reached");
    pcVar8 = ctx->errorBufLocation;
    sVar6 = strlen(pcVar8);
    ctx->errorBufLocation = pcVar8 + sVar6;
    if (ctx->errorHandlerActive == false) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x75,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

void ReportAt(ExpressionContext &ctx, SynBase *source, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			// Shouldn't report errors that are caused by error recovery
			assert(strstr(ctx.errorBufLocation, "%error-type%") == NULL);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, pos));

			if(const char *code = FindModuleCodeWithSourceLocation(ctx, pos))
			{
				AddErrorLocationInfo(code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				if(code != ctx.code)
				{
					ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

					if(parentModule)
					{
						NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

						ctx.errorBufLocation += strlen(ctx.errorBufLocation);

						ctx.errorInfo.back()->parentModule = parentModule;
					}
				}
			}
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}